

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# senone.c
# Opt level: O0

void build_mgau2sen(senone_t *s,int32 n_cw)

{
  uint uVar1;
  uint32 uVar2;
  uint32 uVar3;
  mgau2sen_t *pmVar4;
  uint32 *puVar5;
  mixw_t *pmVar6;
  senprob_t **ppsVar7;
  mixw_t *fw;
  s3senid_t *sen;
  uint local_20;
  int32 f;
  int32 m;
  int32 j;
  int32 i;
  int32 n_cw_local;
  senone_t *s_local;
  
  pmVar4 = (mgau2sen_t *)
           __ckd_calloc__((ulong)s->n_mgau,0x18,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                          ,0xa2);
  s->mgau2sen = pmVar4;
  puVar5 = (uint32 *)
           __ckd_calloc__((ulong)s->n_sen,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                          ,0xa3);
  s->mgau2sen_idx = puVar5;
  m = 0;
  while( true ) {
    if (s->n_sen <= (uint)m) {
      fw = (mixw_t *)
           __ckd_calloc__((ulong)s->n_sen,2,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                          ,0xaa);
      for (local_20 = 0; local_20 < s->n_mgau; local_20 = local_20 + 1) {
        s->mgau2sen[(int)local_20].sen = (s3senid_t *)fw;
        fw = (mixw_t *)((long)&fw->n_wt + (long)s->mgau2sen[(int)local_20].n_sen * 2);
        s->mgau2sen[(int)local_20].n_sen = 0;
      }
      for (m = 0; (uint)m < s->n_sen; m = m + 1) {
        uVar2 = s->sen2mgau[m];
        uVar3 = s->mgau2sen[(int)uVar2].n_sen;
        s->mgau2sen[(int)uVar2].sen[(int)uVar3] = (s3senid_t)m;
        s->mgau2sen_idx[m] = uVar3;
        s->mgau2sen[(int)uVar2].n_sen = s->mgau2sen[(int)uVar2].n_sen + 1;
      }
      for (local_20 = 0; local_20 < s->n_mgau; local_20 = local_20 + 1) {
        pmVar6 = (mixw_t *)
                 __ckd_calloc__((ulong)s->n_feat,0x10,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                ,0xbb);
        s->mgau2sen[(int)local_20].feat_mixw = pmVar6;
        for (sen._4_4_ = 0; sen._4_4_ < s->n_feat; sen._4_4_ = sen._4_4_ + 1) {
          pmVar6[(int)sen._4_4_].n_wt = n_cw;
          ppsVar7 = (senprob_t **)
                    __ckd_calloc_2d__((long)s->mgau2sen[(int)local_20].n_sen,(long)n_cw,1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                      ,0xc1);
          pmVar6[(int)sen._4_4_].prob = ppsVar7;
        }
      }
      return;
    }
    uVar1 = s->sen2mgau[m];
    if ((s->n_mgau <= uVar1) || ((int)uVar1 < 0)) break;
    s->mgau2sen[(int)uVar1].n_sen = s->mgau2sen[(int)uVar1].n_sen + 1;
    m = m + 1;
  }
  __assert_fail("(m < s->n_mgau) && (m >= 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                ,0xa6,"void build_mgau2sen(senone_t *, int32)");
}

Assistant:

static void build_mgau2sen (senone_t *s, int32 n_cw)
{
    int32 i, j, m, f;
    s3senid_t *sen;
    mixw_t *fw;
    
    /* Create mgau2sen map from sen2mgau */
    s->mgau2sen = (mgau2sen_t *) ckd_calloc (s->n_mgau, sizeof(mgau2sen_t));
    s->mgau2sen_idx = (uint32 *) ckd_calloc (s->n_sen, sizeof(int32));
    for (i = 0; i < s->n_sen; i++) {
	m = s->sen2mgau[i];
	assert ((m < s->n_mgau) && (m >= 0));
	(s->mgau2sen[m].n_sen)++;
    }
    
    sen = (s3senid_t *) ckd_calloc (s->n_sen, sizeof(s3senid_t));
    for (m = 0; m < s->n_mgau; m++) {
	s->mgau2sen[m].sen = sen;
	sen += s->mgau2sen[m].n_sen;
	s->mgau2sen[m].n_sen = 0;
    }

    for (i = 0; i < s->n_sen; i++) {
	m = s->sen2mgau[i];
	j = s->mgau2sen[m].n_sen;
	s->mgau2sen[m].sen[j] = i;
	s->mgau2sen_idx[i] = j;
	(s->mgau2sen[m].n_sen)++;
    }
    
    /* Allocate space for the weights */
    for (m = 0; m < s->n_mgau; m++) {
	fw = (mixw_t *) ckd_calloc (s->n_feat, sizeof(mixw_t));
	s->mgau2sen[m].feat_mixw = fw;

	for (f = 0; f < s->n_feat; f++) {
	    fw[f].n_wt = n_cw;
	    fw[f].prob = (senprob_t **) ckd_calloc_2d (s->mgau2sen[m].n_sen, n_cw,
						       sizeof(senprob_t));
	}
    }
}